

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O1

bool pvmath::houghTransform<float>(void)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  size_type __n;
  uint uVar11;
  pointer pPVar12;
  bool bVar13;
  float __x;
  float fVar14;
  float fVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_register_00001344 [12];
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOffLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOnLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> point;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_b8;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_98;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_80;
  undefined1 local_68 [16];
  double local_50;
  undefined1 local_48 [16];
  
  uVar7 = Test_Helper::runCount();
  bVar13 = uVar7 == 0;
  if (!bVar13) {
    uVar11 = 0;
    do {
      iVar8 = rand();
      dVar16 = toRadians((double)(iVar8 + -0xb4 + (iVar8 / 0x168) * -0x168));
      __x = (float)dVar16;
      iVar8 = rand();
      auVar17._0_4_ = (float)(iVar8 % 100);
      auVar17._4_12_ = in_register_00001344;
      auVar17 = vfmadd213ss_fma(auVar17,SUB6416(ZEXT464(0x3dcccccd),0),ZEXT416(0));
      local_50 = toRadians((double)(auVar17._0_4_ + 0.1));
      uVar9 = rand();
      uVar5 = uVar9 % 0x32;
      if (uVar9 % 0x32 < 2) {
        uVar5 = 1;
      }
      iVar8 = rand();
      auVar18._0_4_ = (float)(iVar8 % 0x1ea);
      auVar18._4_12_ = in_register_00001344;
      auVar17 = vfmadd132ss_fma(auVar18,SUB6416(ZEXT464(0x3dcccccd),0),ZEXT416(0x3c23d70a));
      uVar9 = rand();
      __n = (size_type)(uVar9 % 100);
      if (uVar9 % 100 < 0x33) {
        __n = 0x32;
      }
      std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::vector
                (&local_80,__n,(allocator_type *)&local_98);
      fVar14 = sinf(__x);
      fVar15 = cosf(__x);
      if (local_80.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_80.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        fVar1 = auVar17._0_4_ * 0.5;
        auVar22._8_4_ = 0x80000000;
        auVar22._0_8_ = 0x8000000080000000;
        auVar22._12_4_ = 0x80000000;
        local_68 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar22);
        local_48 = ZEXT416((uint)(fVar1 / 10.0));
        uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar1),ZEXT816(0) << 0x20,1);
        uVar3 = vcmpps_avx512vl(local_48,ZEXT816(0) << 0x20,1);
        uVar4 = (ushort)uVar2 | (ushort)uVar3;
        iVar8 = (int)((fVar1 + fVar1) / (fVar1 / 10.0));
        pPVar12 = local_80.
                  super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        do {
          iVar10 = rand();
          auVar20._0_4_ = (float)(iVar10 % 200000);
          auVar20._4_12_ = in_register_00001344;
          auVar18 = vfmadd132ss_fma(auVar20,SUB6416(ZEXT464(0xc47a0000),0),ZEXT416(0x3c23d70a));
          auVar22 = local_68;
          if ((uVar4 & 1) == 0) {
            iVar10 = rand();
            auVar21._0_4_ = (float)(iVar10 % iVar8);
            auVar21._4_12_ = in_register_00001344;
            auVar22 = vfmadd132ss_fma(auVar21,local_68,ZEXT416((uint)local_48._0_4_));
          }
          auVar20 = local_68;
          if ((uVar4 & 1) == 0) {
            iVar10 = rand();
            auVar19._0_4_ = (float)(iVar10 % iVar8);
            auVar19._4_12_ = in_register_00001344;
            auVar20 = vfmadd213ss_fma(auVar19,local_48,ZEXT416((uint)local_68._0_4_));
          }
          auVar22 = ZEXT416((uint)(auVar22._0_4_ + auVar18._0_4_));
          auVar18 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * auVar20._0_4_)),auVar22,
                                    ZEXT416((uint)fVar15));
          pPVar12->x = auVar18._0_4_;
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * auVar20._0_4_)),ZEXT416((uint)fVar14),
                                    auVar22);
          pPVar12->y = auVar18._0_4_;
          pPVar12 = pPVar12 + 1;
        } while (pPVar12 !=
                 local_80.
                 super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      local_98.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar6 = Image_Function::HoughTransform
                        (&local_80,__x,(float)local_50,(float)local_50 / (float)uVar5,auVar17._0_4_,
                         &local_98,&local_b8);
      if ((!bVar6) ||
         (local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        if (local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_98.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.
                          super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_80.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          return bVar13;
        }
        operator_delete(local_80.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        return bVar13;
      }
      if (local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_80.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
      uVar7 = Test_Helper::runCount();
      bVar13 = uVar11 >= uVar7;
    } while (uVar11 < uVar7);
  }
  return bVar13;
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }